

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_server.hpp
# Opt level: O0

void __thiscall
cinatra::coro_http_server::set_static_res_dir<>
          (coro_http_server *this,string_view uri_suffix,string *file_path)

{
  byte bVar1;
  bool bVar2;
  size_type sVar3;
  size_type sVar4;
  reference this_00;
  long in_RDI;
  size_t pos;
  string relative_path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *file_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_1;
  string uri;
  path router_path;
  directory_entry *file;
  recursive_directory_iterator __end2;
  recursive_directory_iterator __begin2;
  recursive_directory_iterator *__range2;
  error_code ec;
  bool has_double_dot;
  _Path<std::__cxx11::basic_string<char>_> *in_stack_fffffffffffff9e8;
  _Path<std::__cxx11::basic_string<char>_> *in_stack_fffffffffffff9f0;
  recursive_directory_iterator *in_stack_fffffffffffff9f8;
  string *in_stack_fffffffffffffa00;
  char *in_stack_fffffffffffffa08;
  path *in_stack_fffffffffffffa10;
  undefined7 in_stack_fffffffffffffa18;
  undefined1 in_stack_fffffffffffffa1f;
  path *in_stack_fffffffffffffa20;
  path *ppVar5;
  path *in_stack_fffffffffffffa28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa30;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffa38;
  path *in_stack_fffffffffffffa40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa48;
  path *in_stack_fffffffffffffa50;
  path *in_stack_fffffffffffffa60;
  string *in_stack_fffffffffffffa68;
  undefined6 in_stack_fffffffffffffa70;
  byte bVar6;
  bool local_569;
  recursive_directory_iterator local_4d1 [2];
  string local_4a9;
  ulong local_488;
  reference local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_410;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_408;
  long local_400;
  directory_entry *local_390;
  recursive_directory_iterator local_388;
  recursive_directory_iterator local_378;
  recursive_directory_iterator local_368;
  recursive_directory_iterator local_358;
  path local_348;
  recursive_directory_iterator local_320;
  recursive_directory_iterator *local_310;
  undefined1 local_308 [128];
  path local_288;
  path local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8 [3];
  path local_188;
  path local_140 [2];
  path local_d0;
  byte local_85;
  bool local_21;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (&in_stack_fffffffffffffa10->_M_pathname,in_stack_fffffffffffffa08,
                     (size_type)in_stack_fffffffffffffa00);
  local_569 = true;
  if (sVar3 == 0xffffffffffffffff) {
    sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::find
                      ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffa10
                       ,in_stack_fffffffffffffa08,(size_type)in_stack_fffffffffffffa00);
    local_569 = sVar4 != 0xffffffffffffffff;
  }
  local_21 = local_569;
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (in_stack_fffffffffffffa50,in_stack_fffffffffffffa48,
             (format)((ulong)in_stack_fffffffffffffa40 >> 0x38));
  bVar1 = std::filesystem::__cxx11::path::has_root_path();
  local_85 = 0;
  bVar6 = 1;
  if ((bVar1 & 1) == 0) {
    std::filesystem::__cxx11::path::
    path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
              (in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,
               (format)((ulong)in_stack_fffffffffffffa30 >> 0x38));
    local_85 = 1;
    bVar1 = std::filesystem::__cxx11::path::has_root_path();
    bVar6 = 1;
    if ((bVar1 & 1) == 0) {
      bVar6 = local_21;
    }
  }
  bVar1 = bVar6;
  if ((local_85 & 1) != 0) {
    std::filesystem::__cxx11::path::~path(in_stack_fffffffffffff9f0);
  }
  std::filesystem::__cxx11::path::~path(in_stack_fffffffffffff9f0);
  if ((bVar6 & 1) != 0) {
    cerr_logger_t::operator<<
              ((cerr_logger_t *)in_stack_fffffffffffff9f0,(char (*) [20])in_stack_fffffffffffff9e8);
    cerr_logger_t::operator<<
              ((cerr_logger_t *)in_stack_fffffffffffff9f0,&in_stack_fffffffffffff9e8->_M_pathname);
    cerr_logger_t::~cerr_logger_t((cerr_logger_t *)0x4001fe);
    exit(1);
  }
  bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_10);
  if (!bVar2) {
    std::filesystem::__cxx11::path::
    path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
              (in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,
               (format)((ulong)in_stack_fffffffffffffa30 >> 0x38));
    in_stack_fffffffffffffa60 = std::filesystem::__cxx11::path::make_preferred(&local_d0);
    std::filesystem::__cxx11::path::string
              ((path *)CONCAT17(in_stack_fffffffffffffa1f,in_stack_fffffffffffffa18));
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&in_stack_fffffffffffffa50->_M_pathname,in_stack_fffffffffffffa48);
    std::__cxx11::string::~string(&in_stack_fffffffffffff9f0->_M_pathname);
    std::filesystem::__cxx11::path::~path(in_stack_fffffffffffff9f0);
  }
  bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x400318);
  if (bVar2) {
    in_stack_fffffffffffffa30 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_308 + 0x10);
    std::filesystem::current_path_abi_cxx11_();
    std::filesystem::__cxx11::path::string
              ((path *)CONCAT17(in_stack_fffffffffffffa1f,in_stack_fffffffffffffa18));
    std::filesystem::__cxx11::path::path
              (in_stack_fffffffffffffa20,
               (string_type *)CONCAT17(in_stack_fffffffffffffa1f,in_stack_fffffffffffffa18),
               (format)((ulong)in_stack_fffffffffffffa10 >> 0x38));
    std::filesystem::absolute(&local_288);
    std::filesystem::__cxx11::path::string
              ((path *)CONCAT17(in_stack_fffffffffffffa1f,in_stack_fffffffffffffa18));
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&in_stack_fffffffffffffa50->_M_pathname,in_stack_fffffffffffffa48);
    std::__cxx11::string::~string(&in_stack_fffffffffffff9f0->_M_pathname);
    std::filesystem::__cxx11::path::~path(in_stack_fffffffffffff9f0);
    std::filesystem::__cxx11::path::~path(in_stack_fffffffffffff9f0);
    std::__cxx11::string::~string(&in_stack_fffffffffffff9f0->_M_pathname);
    std::filesystem::__cxx11::path::~path(in_stack_fffffffffffff9f0);
  }
  else {
    in_stack_fffffffffffffa50 = local_140;
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              (in_stack_fffffffffffffa50,in_stack_fffffffffffffa48,
               (format)((ulong)in_stack_fffffffffffffa40 >> 0x38));
    std::filesystem::__cxx11::path::filename(in_stack_fffffffffffffa28);
    std::filesystem::__cxx11::path::string
              ((path *)CONCAT17(in_stack_fffffffffffffa1f,in_stack_fffffffffffffa18));
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&in_stack_fffffffffffffa50->_M_pathname,in_stack_fffffffffffffa48);
    std::__cxx11::string::~string(&in_stack_fffffffffffff9f0->_M_pathname);
    std::filesystem::__cxx11::path::~path(in_stack_fffffffffffff9f0);
    std::filesystem::__cxx11::path::~path(in_stack_fffffffffffff9f0);
    bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4003b3
                      );
    if (bVar2) {
      in_stack_fffffffffffffa48 = local_1f8;
      std::filesystem::current_path_abi_cxx11_();
      std::filesystem::__cxx11::path::string
                ((path *)CONCAT17(in_stack_fffffffffffffa1f,in_stack_fffffffffffffa18));
      std::filesystem::__cxx11::path::path
                (in_stack_fffffffffffffa20,
                 (string_type *)CONCAT17(in_stack_fffffffffffffa1f,in_stack_fffffffffffffa18),
                 (format)((ulong)in_stack_fffffffffffffa10 >> 0x38));
      std::filesystem::absolute(&local_188);
      std::filesystem::__cxx11::path::string
                ((path *)CONCAT17(in_stack_fffffffffffffa1f,in_stack_fffffffffffffa18));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&in_stack_fffffffffffffa50->_M_pathname,in_stack_fffffffffffffa48);
      std::__cxx11::string::~string(&in_stack_fffffffffffff9f0->_M_pathname);
      std::filesystem::__cxx11::path::~path(in_stack_fffffffffffff9f0);
      std::filesystem::__cxx11::path::~path(in_stack_fffffffffffff9f0);
      std::__cxx11::string::~string(&in_stack_fffffffffffff9f0->_M_pathname);
      std::filesystem::__cxx11::path::~path(in_stack_fffffffffffff9f0);
    }
    else {
      ppVar5 = &local_240;
      std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                (in_stack_fffffffffffffa50,in_stack_fffffffffffffa48,
                 (format)((ulong)in_stack_fffffffffffffa40 >> 0x38));
      in_stack_fffffffffffffa40 = std::filesystem::__cxx11::path::make_preferred(ppVar5);
      std::filesystem::__cxx11::path::string
                ((path *)CONCAT17(in_stack_fffffffffffffa1f,in_stack_fffffffffffffa18));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&in_stack_fffffffffffffa50->_M_pathname,in_stack_fffffffffffffa48);
      std::__cxx11::string::~string(&in_stack_fffffffffffff9f0->_M_pathname);
      std::filesystem::__cxx11::path::~path(in_stack_fffffffffffff9f0);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x400782);
  __str = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_308;
  std::error_code::error_code((error_code *)in_stack_fffffffffffff9f0);
  ppVar5 = &local_348;
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (in_stack_fffffffffffffa50,in_stack_fffffffffffffa48,
             (format)((ulong)in_stack_fffffffffffffa40 >> 0x38));
  std::filesystem::__cxx11::recursive_directory_iterator::recursive_directory_iterator
            ((recursive_directory_iterator *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,
             (error_code *)0x4007d1);
  std::filesystem::__cxx11::path::~path(in_stack_fffffffffffff9f0);
  local_310 = &local_320;
  std::filesystem::__cxx11::recursive_directory_iterator::recursive_directory_iterator
            ((recursive_directory_iterator *)in_stack_fffffffffffff9f0,
             (recursive_directory_iterator *)in_stack_fffffffffffff9e8);
  std::filesystem::__cxx11::begin((recursive_directory_iterator *)in_stack_fffffffffffff9e8);
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator(&local_368);
  std::filesystem::__cxx11::recursive_directory_iterator::recursive_directory_iterator
            ((recursive_directory_iterator *)in_stack_fffffffffffff9f0,
             (recursive_directory_iterator *)in_stack_fffffffffffff9e8);
  std::filesystem::__cxx11::end(in_stack_fffffffffffff9f8);
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator(&local_388);
  while (bVar2 = std::filesystem::__cxx11::operator!=
                           ((recursive_directory_iterator *)in_stack_fffffffffffff9f0,
                            (recursive_directory_iterator *)in_stack_fffffffffffff9e8), bVar2) {
    local_390 = (directory_entry *)
                std::filesystem::__cxx11::recursive_directory_iterator::operator*(&local_358);
    bVar2 = std::error_code::operator_cast_to_bool((error_code *)local_308);
    if ((!bVar2) &&
       (in_stack_fffffffffffffa1f =
             std::filesystem::__cxx11::directory_entry::is_directory((directory_entry *)0x400903),
       !(bool)in_stack_fffffffffffffa1f)) {
      in_stack_fffffffffffffa10 = (path *)(in_RDI + 0x208);
      std::filesystem::__cxx11::directory_entry::path(local_390);
      std::filesystem::__cxx11::path::string
                ((path *)CONCAT17(in_stack_fffffffffffffa1f,in_stack_fffffffffffffa18));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffff9f0,&in_stack_fffffffffffff9e8->_M_pathname);
      std::__cxx11::string::~string(&in_stack_fffffffffffff9f0->_M_pathname);
    }
    std::filesystem::__cxx11::recursive_directory_iterator::operator++(&local_358);
  }
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator(&local_378);
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator(&local_358);
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator(&local_320);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (in_stack_fffffffffffffa50,in_stack_fffffffffffffa48,
             (format)((ulong)in_stack_fffffffffffffa40 >> 0x38));
  std::__cxx11::string::string(in_stack_fffffffffffffa00);
  local_400 = in_RDI + 0x208;
  local_408._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffff9e8);
  local_410 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffff9e8);
  while (bVar2 = __gnu_cxx::
                 operator==<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_fffffffffffff9f0,
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_fffffffffffff9e8), ((bVar2 ^ 0xffU) & 1) != 0) {
    this_00 = __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator*(&local_408);
    local_418 = this_00;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::length
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0x1e8)
              );
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (this_00,(size_type)in_stack_fffffffffffffa00,(size_type)in_stack_fffffffffffff9f8);
    std::filesystem::__cxx11::path::path
              (ppVar5,(string_type *)CONCAT17(in_stack_fffffffffffffa1f,in_stack_fffffffffffffa18),
               (format)((ulong)in_stack_fffffffffffffa10 >> 0x38));
    std::filesystem::__cxx11::path::string
              ((path *)CONCAT17(in_stack_fffffffffffffa1f,in_stack_fffffffffffffa18));
    std::filesystem::__cxx11::path::~path(in_stack_fffffffffffff9f0);
    std::__cxx11::string::~string(&in_stack_fffffffffffff9f0->_M_pathname);
    sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                      (in_stack_fffffffffffffa30,(char)((ulong)__str >> 0x38),(size_type)ppVar5);
    local_488 = (ulong)(sVar3 != 0xffffffffffffffff);
    if (local_488 != 0) {
      in_stack_fffffffffffffa00 = &local_4a9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffa30,(char *)__str,(allocator<char> *)ppVar5);
      in_stack_fffffffffffff9f8 = local_4d1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffa30,(char *)__str,(allocator<char> *)ppVar5);
      replace_all(&in_stack_fffffffffffffa10->_M_pathname,this_00,in_stack_fffffffffffffa00);
      std::__cxx11::string::~string(&in_stack_fffffffffffff9f0->_M_pathname);
      std::allocator<char>::~allocator((allocator<char> *)local_4d1);
      std::__cxx11::string::~string(&in_stack_fffffffffffff9f0->_M_pathname);
      std::allocator<char>::~allocator((allocator<char> *)&local_4a9);
    }
    bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x400cf0
                      );
    if (bVar2) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&in_stack_fffffffffffff9f0->_M_pathname,&in_stack_fffffffffffff9e8->_M_pathname);
    }
    else {
      std::filesystem::__cxx11::path::path<char[2],std::filesystem::__cxx11::path>
                (in_stack_fffffffffffffa50,(char (*) [2])in_stack_fffffffffffffa48,
                 (format)((ulong)in_stack_fffffffffffffa40 >> 0x38));
      in_stack_fffffffffffff9f0 =
           std::filesystem::__cxx11::path::append<std::__cxx11::string>
                     (in_stack_fffffffffffffa10,this_00);
      in_stack_fffffffffffff9e8 =
           std::filesystem::__cxx11::path::concat<std::__cxx11::string>
                     (in_stack_fffffffffffffa10,this_00);
      std::filesystem::__cxx11::path::string
                ((path *)CONCAT17(in_stack_fffffffffffffa1f,in_stack_fffffffffffffa18));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&in_stack_fffffffffffffa50->_M_pathname,in_stack_fffffffffffffa48);
      std::__cxx11::string::~string(&in_stack_fffffffffffff9f0->_M_pathname);
      std::filesystem::__cxx11::path::~path(in_stack_fffffffffffff9f0);
    }
    std::__cxx11::string::string(in_stack_fffffffffffffa30,__str);
    std::__cxx11::string::string(in_stack_fffffffffffffa30,__str);
    set_http_handler<(cinatra::http_method)1,cinatra::coro_http_server::set_static_res_dir<>(std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string)::_lambda(cinatra::coro_http_request&,cinatra::coro_http_response&)_1_>
              ((coro_http_server *)CONCAT17(bVar1,CONCAT16(bVar6,in_stack_fffffffffffffa70)),
               in_stack_fffffffffffffa68,(anon_class_40_2_16f3dfdb *)in_stack_fffffffffffffa60);
    set_static_res_dir<>(std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string)::
    {lambda(cinatra::coro_http_request&,cinatra::coro_http_response&)#1}::~coro_http_response
              ((anon_class_40_2_16f3dfdb *)0x400e55);
    std::__cxx11::string::~string(&in_stack_fffffffffffff9f0->_M_pathname);
    std::__cxx11::string::~string(&in_stack_fffffffffffff9f0->_M_pathname);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_408);
  }
  std::__cxx11::string::~string(&in_stack_fffffffffffff9f0->_M_pathname);
  std::filesystem::__cxx11::path::~path(in_stack_fffffffffffff9f0);
  return;
}

Assistant:

void set_static_res_dir(std::string_view uri_suffix = "",
                          std::string file_path = "www", Aspects &&...aspects) {
    bool has_double_dot = (file_path.find("..") != std::string::npos) ||
                          (uri_suffix.find("..") != std::string::npos);
    if (std::filesystem::path(file_path).has_root_path() ||
        std::filesystem::path(uri_suffix).has_root_path() || has_double_dot) {
      CINATRA_LOG_ERROR << "invalid file path: " << file_path;
      std::exit(1);
    }

    if (!uri_suffix.empty()) {
      static_dir_router_path_ =
          std::filesystem::path(uri_suffix).make_preferred().string();
    }

    if (!file_path.empty()) {
      file_path = std::filesystem::path(file_path).filename().string();
      if (file_path.empty()) {
        static_dir_ = fs::absolute(fs::current_path().string()).string();
      }
      else {
        static_dir_ =
            std::filesystem::path(file_path).make_preferred().string();
      }
    }
    else {
      static_dir_ = fs::absolute(fs::current_path().string()).string();
    }

    files_.clear();
    std::error_code ec;
    for (const auto &file :
         std::filesystem::recursive_directory_iterator(static_dir_, ec)) {
      if (ec) {
        continue;
      }
      if (!file.is_directory()) {
        files_.push_back(file.path().string());
      }
    }

    std::filesystem::path router_path =
        std::filesystem::path(static_dir_router_path_);

    std::string uri;
    for (auto &file : files_) {
      auto relative_path =
          std::filesystem::path(file.substr(static_dir_.length())).string();
      if (size_t pos = relative_path.find('\\') != std::string::npos) {
        replace_all(relative_path, "\\", "/");
      }

      if (static_dir_router_path_.empty()) {
        uri = relative_path;
      }
      else {
        uri = fs::path("/")
                  .append(static_dir_router_path_)
                  .concat(relative_path)
                  .string();
      }

      set_http_handler<cinatra::GET>(
          uri,
          [this, file_name = file](
              coro_http_request &req,
              coro_http_response &resp) -> async_simple::coro::Lazy<void> {
            std::string_view extension = get_extension(file_name);
            std::string_view mime = get_mime_type(extension);
            auto range_str = req.get_header_value("Range");

            if (auto it = static_file_cache_.find(file_name);
                it != static_file_cache_.end()) {
              auto range_header = build_range_header(
                  mime, file_name, std::to_string(fs::file_size(file_name)));
              resp.set_delay(true);
              std::string &body = it->second;
              std::array<asio::const_buffer, 2> arr{asio::buffer(range_header),
                                                    asio::buffer(body)};
              co_await req.get_conn()->async_write(arr);
              co_return;
            }

            std::string content;
            detail::resize(content, chunked_size_);

            coro_io::coro_file in_file{};
            in_file.open(file_name, std::ios::in);
            if (!in_file.is_open()) {
              resp.set_status_and_content(status_type::not_found,
                                          file_name + "not found");
              co_return;
            }

            size_t file_size = fs::file_size(file_name);

            if (format_type_ == file_resp_format_type::chunked &&
                range_str.empty()) {
              resp.set_format_type(format_type::chunked);
              bool ok;
              if (ok = co_await resp.get_conn()->begin_chunked(); !ok) {
                co_return;
              }

              while (true) {
                auto [ec, size] =
                    co_await in_file.async_read(content.data(), content.size());
                if (ec) {
                  resp.set_status(status_type::no_content);
                  co_await resp.get_conn()->reply();
                  co_return;
                }

                bool r = co_await resp.get_conn()->write_chunked(
                    std::string_view(content.data(), size));
                if (!r) {
                  co_return;
                }

                if (in_file.eof()) {
                  co_await resp.get_conn()->end_chunked();
                  break;
                }
              }
            }
            else {
              auto pos = range_str.find('=');
              if (pos != std::string_view::npos) {
                range_str = range_str.substr(pos + 1);
                bool is_valid = true;
                auto ranges =
                    parse_ranges(range_str, fs::file_size(file_name), is_valid);
                if (!is_valid) {
                  resp.set_status(status_type::range_not_satisfiable);
                  co_return;
                }

                assert(!ranges.empty());

                if (ranges.size() == 1) {
                  // single part
                  auto [start, end] = ranges[0];
                  in_file.seek(start, std::ios::beg);
                  size_t part_size = end + 1 - start;
                  int status = (part_size == file_size) ? 200 : 206;
                  std::string content_range = "Content-Range: bytes ";
                  content_range.append(std::to_string(start))
                      .append("-")
                      .append(std::to_string(end))
                      .append("/")
                      .append(std::to_string(file_size))
                      .append(CRCF);
                  auto range_header = build_range_header(
                      mime, file_name, std::to_string(part_size), status,
                      content_range);
                  resp.set_delay(true);
                  bool r = co_await req.get_conn()->write_data(range_header);
                  if (!r) {
                    co_return;
                  }

                  co_await send_single_part(in_file, content, req, resp,
                                            part_size);
                }
                else {
                  // multiple ranges
                  resp.set_delay(true);
                  std::string file_size_str = std::to_string(file_size);
                  size_t content_len = 0;
                  std::vector<std::string> multi_heads = build_part_heads(
                      ranges, mime, file_size_str, content_len);
                  auto range_header = build_multiple_range_header(content_len);
                  bool r = co_await req.get_conn()->write_data(range_header);
                  if (!r) {
                    co_return;
                  }

                  for (int i = 0; i < ranges.size(); i++) {
                    std::string &part_header = multi_heads[i];
                    r = co_await req.get_conn()->write_data(part_header);
                    if (!r) {
                      co_return;
                    }

                    auto [start, end] = ranges[i];
                    bool ok = in_file.seek(start, std::ios::beg);
                    if (!ok) {
                      resp.set_status_and_content(status_type::bad_request,
                                                  "invalid range");
                      co_await resp.get_conn()->reply();
                      co_return;
                    }
                    size_t part_size = end + 1 - start;

                    std::string_view more = CRCF;
                    if (i == ranges.size() - 1) {
                      more = MULTIPART_END;
                    }
                    r = co_await send_single_part(in_file, content, req, resp,
                                                  part_size, more);
                    if (!r) {
                      co_return;
                    }
                  }
                }
                co_return;
              }

              auto range_header = build_range_header(mime, file_name,
                                                     std::to_string(file_size));
              resp.set_delay(true);
              bool r = co_await req.get_conn()->write_data(range_header);
              if (!r) {
                co_return;
              }

              while (true) {
                auto [ec, size] =
                    co_await in_file.async_read(content.data(), content.size());
                if (ec) {
                  resp.set_status(status_type::no_content);
                  co_await resp.get_conn()->reply();
                  co_return;
                }

                r = co_await req.get_conn()->write_data(
                    std::string_view(content.data(), size));
                if (!r) {
                  co_return;
                }

                if (in_file.eof()) {
                  break;
                }
              }
            }
          },
          std::forward<Aspects>(aspects)...);
    }
  }